

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

string * amrex::VisMF::DirName(string *filename)

{
  char *pcVar1;
  int iVar2;
  string *in_RDI;
  char *buf;
  int len;
  char *slash;
  char *str;
  string *dirname;
  allocator local_4a;
  undefined1 local_49;
  char *local_48;
  int local_3c;
  char *local_38;
  char *local_30;
  allocator local_11 [17];
  
  if ((DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_),
     iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_,"",local_11
              );
    std::allocator<char>::~allocator((allocator<char> *)local_11);
    __cxa_atexit(std::__cxx11::string::~string,
                 &DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_);
  }
  local_30 = (char *)std::__cxx11::string::c_str();
  local_38 = strrchr(local_30,0x2f);
  if (local_38 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)in_RDI,
               (string *)&DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_);
  }
  else {
    local_3c = ((int)local_38 - (int)local_30) + 1;
    local_48 = (char *)operator_new__((long)(((int)local_38 - (int)local_30) + 2));
    strncpy(local_48,local_30,(long)local_3c);
    pcVar1 = local_48;
    local_48[local_3c] = '\0';
    local_49 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_4a);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a);
    if (local_48 != (char *)0x0) {
      operator_delete__(local_48);
    }
  }
  return in_RDI;
}

Assistant:

std::string
VisMF::DirName (const std::string& filename)
{
    BL_ASSERT(filename[filename.length() - 1] != '/');

    static const std::string TheNullString("");

    const char *str = filename.c_str();

    if(const char *slash = strrchr(str, '/')) {
        //
        // Got at least one slash -- return the dirname including last slash.
        //
        int len((slash - str) + 1);

        char *buf = new char[len+1];

        strncpy(buf, str, len);

        buf[len] = 0;   // Stringify

        std::string dirname = buf;

        delete [] buf;

        return dirname;
    } else {
        //
        // No directory name here.
        //
        return TheNullString;
    }
}